

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O2

CTPNStm * __thiscall CTcParser::parse_do_while(CTcParser *this,int *err)

{
  CTPNStmEnclosing *pCVar1;
  long lVar2;
  int iVar3;
  CTPNStmDoWhile *this_00;
  CTPNStm *pCVar4;
  CTcPrsNode *pCVar5;
  
  this_00 = (CTPNStmDoWhile *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x58,(size_t)err);
  CTPNStmDoWhile::CTPNStmDoWhile(this_00,this->enclosing_stm_);
  CTcTokenizer::next(G_tok);
  pCVar1 = this->enclosing_stm_;
  this->enclosing_stm_ = (CTPNStmEnclosing *)this_00;
  pCVar4 = parse_stm(this,err,(CTPNStmSwitch *)0x0,0);
  this->enclosing_stm_ = pCVar1;
  if (*err == 0) {
    if ((G_tok->curtok_).typ_ == TOKT_WHILE) {
      CTcTokenizer::next(G_tok);
    }
    else {
      CTcTokenizer::log_error_curtok(G_tok,0x2b42);
    }
    if ((G_tok->curtok_).typ_ == TOKT_LPAR) {
      CTcTokenizer::next(G_tok);
    }
    else {
      CTcTokenizer::log_error_curtok(G_tok,0x2b3f);
    }
    pCVar5 = parse_cond_expr(this);
    if (pCVar5 != (CTcPrsNode *)0x0) {
      if ((G_tok->curtok_).typ_ == TOKT_RPAR) {
        CTcTokenizer::next(G_tok);
      }
      else {
        CTcTokenizer::log_error_curtok(G_tok,0x2b40);
      }
      (this_00->super_CTPNStmDoWhileBase).cond_expr_ = pCVar5;
      (this_00->super_CTPNStmDoWhileBase).body_stm_ = pCVar4;
      lVar2 = G_tok->last_linenum_;
      (this_00->super_CTPNStmDoWhileBase).while_desc_ = G_tok->last_desc_;
      (this_00->super_CTPNStmDoWhileBase).while_linenum_ = lVar2;
      iVar3 = parse_req_sem();
      if (iVar3 == 0) {
        return (CTPNStm *)this_00;
      }
    }
    *err = 1;
  }
  return (CTPNStm *)0x0;
}

Assistant:

CTPNStm *CTcParser::parse_do_while(int *err)
{
    CTPNStm *body_stm;
    CTcPrsNode *expr;
    CTPNStmDoWhile *do_stm;
    CTPNStmEnclosing *old_enclosing;
    
    /* create the statement object */
    do_stm = new CTPNStmDoWhile(enclosing_stm_);

    /* skip the 'do' keyword */
    G_tok->next();

    /* set the 'do' to be the enclosing statement */
    old_enclosing = set_enclosing_stm(do_stm);

    /* parse the loop body */
    body_stm = parse_stm(err, 0, FALSE);

    /* restore the enclosing statement */
    set_enclosing_stm(old_enclosing);

    /* return on failure */
    if (*err)
        return 0;

    /* require the 'while' keyword */
    if (G_tok->cur() == TOKT_WHILE)
    {
        /* skip the 'while' */
        G_tok->next();
    }
    else
    {
        /* 
         *   no 'while' keyword - there's no obvious way to correct this,
         *   so simply ignore the 'do' statement and keep going from here,
         *   on the assumption that they inadvertantly started a new
         *   statement without finishing the 'do' 
         */
        G_tok->log_error_curtok(TCERR_REQ_DO_WHILE);
    }

    /* require the open paren */
    if (G_tok->cur() == TOKT_LPAR)
        G_tok->next();
    else
        G_tok->log_error_curtok(TCERR_REQ_WHILE_LPAR);

    /* parse the expression */
    expr = parse_cond_expr();
    if (expr == 0)
    {
        *err = TRUE;
        return 0;
    }

    /* require the close paren */
    if (G_tok->cur() == TOKT_RPAR)
        G_tok->next();
    else
        G_tok->log_error_curtok(TCERR_REQ_WHILE_RPAR);

    /* set the condition expression and body in the 'do' node */
    do_stm->set_cond(expr);
    do_stm->set_body(body_stm);

    /* 
     *   remember the location of the 'while' part, since this part
     *   generates code 
     */
    do_stm->set_while_pos(G_tok->get_last_desc(), G_tok->get_last_linenum());

    /* parse the required closing semicolon */
    if (parse_req_sem())
    {
        *err = TRUE;
        return 0;
    }

    /* return the new 'do-while' node */
    return do_stm;
}